

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O0

thecl_t * th06_open(FILE *stream,uint version)

{
  short sVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  size_t length;
  void *map_00;
  undefined8 *__s;
  char *pcVar5;
  thecl_instr_t *ptVar6;
  thecl_instr_t *ptVar7;
  thecl_param_t *ptVar8;
  char *pcVar9;
  thecl_param_t *data;
  bool bVar10;
  thecl_param_t *local_2c8;
  value_t *value_iter_1;
  value_t *values_1;
  thecl_param_t *param0;
  size_t d_1;
  char *format_1;
  thecl_instr_t *instr_1;
  thecl_instr_t *new_3;
  thecl_instr_t *new_2;
  th06_timeline_instr_t *raw_instr_1;
  char local_278 [5];
  uint8_t rank_1;
  uint16_t time_1;
  char name_1 [128];
  size_t e;
  thecl_timeline_t *timeline;
  thecl_param_t *param;
  long lStack_1d8;
  char f;
  size_t p;
  value_t *pvStack_1c8;
  uint16_t param_mask;
  value_t *value_iter;
  value_t *values;
  size_t d;
  char *format;
  thecl_instr_t *instr;
  thecl_instr_t *new_1;
  uint16_t rank_mask;
  thecl_instr_t *new;
  th06_instr_t *raw_instr;
  void *raw_sub;
  uint time;
  thecl_sub_t *sub;
  char name [256];
  ulong uStack_58;
  uint rank;
  size_t s;
  thecl_t *ecl;
  size_t timeline_count_max;
  size_t timeline_count;
  th06_header_t *header;
  uchar *map;
  long file_size;
  uint version_local;
  FILE *stream_local;
  
  length = file_fsize(stream);
  if (length == 0xffffffffffffffff) {
    stream_local = (FILE *)0x0;
  }
  else {
    map_00 = file_mmap(stream,length);
    if (map_00 == (void *)0x0) {
      stream_local = (FILE *)0x0;
    }
    else {
      timeline_count = (size_t)map_00;
      if (7 < version) {
        timeline_count = (long)map_00 + 4;
      }
      if (version == 9) {
        timeline_count_max = (size_t)*(ushort *)(timeline_count + 2);
        ecl = (thecl_t *)(ulong)*(ushort *)(timeline_count + 2);
      }
      else if (version == 6) {
        timeline_count_max = 1;
        ecl = (thecl_t *)0x3;
      }
      else {
        timeline_count_max = (size_t)*(ushort *)(timeline_count + 2);
        ecl = (thecl_t *)0x10;
      }
      stream_local = (FILE *)thecl_new();
      stream_local->_flags = version;
      stream_local->_IO_write_ptr = (char *)(ulong)*(ushort *)timeline_count;
      for (uStack_58 = 0; uStack_58 < *(ushort *)timeline_count; uStack_58 = uStack_58 + 1) {
        sVar1 = -0x100;
        __s = (undefined8 *)malloc(0x60);
        memset(__s,0,0x60);
        sprintf((char *)&sub,"Sub%zu",uStack_58);
        pcVar5 = strdup((char *)&sub);
        *__s = pcVar5;
        __s[3] = 0;
        list_init((list_t *)(__s + 7));
        list_init((list_t *)(__s + 9));
        raw_sub._4_4_ = THECL_INSTR_INSTR;
        ptVar6 = (thecl_instr_t *)
                 ((long)map_00 +
                 (ulong)*(uint *)(timeline_count + 4 + ((long)&ecl->version + uStack_58) * 4));
        new = ptVar6;
        while( true ) {
          bVar10 = false;
          if (new->type != ~THECL_INSTR_INSTR) {
            bVar10 = *(short *)&new->field_0x6 != 0;
          }
          if (!bVar10) break;
          iVar4 = (int)new;
          iVar2 = (int)ptVar6;
          if (new->type != raw_sub._4_4_) {
            ptVar7 = thecl_instr_time(new->type);
            ptVar7->offset = iVar4 - iVar2;
            list_append_new((list_t *)(__s + 7),ptVar7);
            raw_sub._4_4_ = new->type;
          }
          if (*(short *)&new->string != sVar1) {
            new_1._6_2_ = *(ushort *)&new->string >> 8;
            if ((version == 6) || (version == 7)) {
              new_1._6_2_ = new_1._6_2_ | 0xf0;
            }
            ptVar7 = thecl_instr_rank((uint)new_1._6_2_);
            ptVar7->offset = iVar4 - iVar2;
            list_append_new((list_t *)(__s + 7),ptVar7);
            sVar1 = *(short *)&new->string;
          }
          ptVar7 = thecl_instr_new();
          ptVar7->id = (uint)*(ushort *)&new->field_0x4;
          ptVar7->size = (uint)*(ushort *)&new->field_0x6;
          ptVar7->offset = iVar4 - iVar2;
          ptVar7->address =
               ptVar7->offset + *(int *)(timeline_count + 4 + ((long)&ecl->version + uStack_58) * 4)
          ;
          if (*(short *)&new->field_0x4 == 0) {
            d = (size_t)anon_var_dwarf_290;
          }
          else {
            d = (size_t)th06_find_format(version,(uint)*(ushort *)&new->field_0x4,false);
          }
          if (d == 0) {
            fprintf(_stderr,"%-3d %04xB R%04x [%04x]: ",(ulong)*(ushort *)&new->field_0x4,
                    (ulong)*(ushort *)&new->field_0x6,(ulong)*(ushort *)&new->string,
                    (ulong)*(ushort *)((long)&new->string + 2));
            for (values = (value_t *)0x0;
                values < (value_t *)((ulong)*(ushort *)&new->field_0x6 - 0xc);
                values = (value_t *)&values->field_0x4) {
              fprintf(_stderr," %08x (%d, %f)",
                      (double)*(float *)((undefined1 *)((long)&new->string + 4) + (long)values),
                      (ulong)*(uint *)((undefined1 *)((long)&new->string + 4) + (long)values),
                      (ulong)*(uint *)((undefined1 *)((long)&new->string + 4) + (long)values));
            }
            fprintf(_stderr,"\n");
          }
          else {
            if (0xc < *(ushort *)&new->field_0x6) {
              if ((version == 7) || (version == 0x5f)) {
                value_iter = value_list_from_data
                                       (th95_value_from_data,(uchar *)((long)&new->string + 4),
                                        (ulong)*(ushort *)&new->field_0x6 - 0xc,(char *)d);
              }
              else if (version == 8) {
                value_iter = value_list_from_data
                                       (th08_value_from_data,(uchar *)((long)&new->string + 4),
                                        (ulong)*(ushort *)&new->field_0x6 - 0xc,(char *)d);
              }
              else {
                value_iter = value_list_from_data
                                       (th06_value_from_data,(uchar *)((long)&new->string + 4),
                                        (ulong)*(ushort *)&new->field_0x6 - 0xc,(char *)d);
              }
              pvStack_1c8 = value_iter;
              p._6_2_ = *(ushort *)((long)&new->string + 2);
              lStack_1d8 = 0;
              while (pvStack_1c8->type != 0) {
                ptVar8 = param_new((int)*(char *)(d + lStack_1d8));
                uVar3 = *(undefined4 *)&pvStack_1c8->field_0x4;
                (ptVar8->value).type = pvStack_1c8->type;
                *(undefined4 *)&(ptVar8->value).field_0x4 = uVar3;
                (ptVar8->value).val.d = (pvStack_1c8->val).d;
                (ptVar8->value).val.m.data = (pvStack_1c8->val).m.data;
                if ((version != 6) && ((p._6_2_ & 1) != 0)) {
                  ptVar8->stack = 1;
                }
                p._6_2_ = (ushort)((int)(uint)p._6_2_ >> 1);
                pvStack_1c8 = pvStack_1c8 + 1;
                lStack_1d8 = lStack_1d8 + 1;
                list_append_new(&ptVar7->params,ptVar8);
              }
              free(value_iter);
            }
            list_append_new((list_t *)(__s + 7),ptVar7);
          }
          new = (thecl_instr_t *)((long)&new->type + (long)(int)(uint)*(ushort *)&new->field_0x6);
        }
        list_append_new((list_t *)&stream_local->_IO_write_end,__s);
      }
      th06_insert_labels((thecl_t *)stream_local);
      name_1[0x78] = '\0';
      name_1[0x79] = '\0';
      name_1[0x7a] = '\0';
      name_1[0x7b] = '\0';
      name_1[0x7c] = '\0';
      name_1[0x7d] = '\0';
      name_1[0x7e] = '\0';
      name_1[0x7f] = '\0';
      for (; (ulong)name_1._120_8_ < timeline_count_max; name_1._120_8_ = name_1._120_8_ + 1) {
        sprintf(local_278,"Timeline%zu",name_1._120_8_);
        pcVar5 = (char *)malloc(0x110);
        strcpy(pcVar5,local_278);
        list_init((list_t *)(pcVar5 + 0x100));
        raw_instr_1._6_2_ = THECL_INSTR_INSTR;
        raw_instr_1._5_1_ = '\0';
        if (7 < version) {
          raw_instr_1._5_1_ = -1;
        }
        new_2 = (thecl_instr_t *)
                ((long)map_00 + (ulong)*(uint *)(timeline_count + 4 + name_1._120_8_ * 4));
        while (iVar4 = th06_check_timeline_sentinel(version,(th06_timeline_instr_t *)new_2),
              iVar4 == 0) {
          if (new_2->field_0x7 != raw_instr_1._5_1_) {
            ptVar6 = thecl_instr_rank((uint)(byte)new_2->field_0x7);
            list_append_new((list_t *)(pcVar5 + 0x100),ptVar6);
            raw_instr_1._5_1_ = new_2->field_0x7;
          }
          if ((short)new_2->type != raw_instr_1._6_2_) {
            ptVar6 = thecl_instr_time((uint)(ushort)(short)new_2->type);
            list_append_new((list_t *)(pcVar5 + 0x100),ptVar6);
            raw_instr_1._6_2_ = (undefined2)new_2->type;
          }
          ptVar6 = thecl_instr_new();
          ptVar6->size = (uint)(byte)new_2->field_0x6;
          ptVar6->id = (uint)*(ushort *)&new_2->field_0x4;
          pcVar9 = th06_find_timeline_format(version,(uint)*(ushort *)&new_2->field_0x4);
          if (pcVar9 == (char *)0x0) {
            fprintf(_stderr,"%-3d %04xB: ",(ulong)*(ushort *)&new_2->field_0x4,
                    (ulong)(byte)new_2->field_0x6);
            for (param0 = (thecl_param_t *)0x0;
                param0 < (thecl_param_t *)((ulong)(byte)new_2->field_0x6 - 8);
                param0 = (thecl_param_t *)&param0->field_0x4) {
              fprintf(_stderr," %08x (%d, %f)",
                      (double)*(float *)((long)&new_2->string + (long)param0),
                      (ulong)*(uint *)((long)&new_2->string + (long)param0),
                      (ulong)*(uint *)((long)&new_2->string + (long)param0));
            }
            fprintf(_stderr,"\n");
          }
          else {
            ptVar8 = param_new((int)*pcVar9);
            (ptVar8->value).val.u = *(undefined2 *)((long)&new_2->type + 2);
            list_append_new(&ptVar6->params,ptVar8);
            if (8 < (byte)new_2->field_0x6) {
              ptVar8 = (thecl_param_t *)
                       value_list_from_data
                                 (value_from_data,(uchar *)&new_2->string,
                                  (ulong)(byte)new_2->field_0x6 - 8,pcVar9 + 1);
              for (local_2c8 = ptVar8; local_2c8->type != 0;
                  local_2c8 = (thecl_param_t *)((long)&(local_2c8->value).val + 8)) {
                data = param_new(local_2c8->type);
                uVar3 = *(undefined4 *)&local_2c8->field_0x4;
                (data->value).type = local_2c8->type;
                *(undefined4 *)&(data->value).field_0x4 = uVar3;
                (data->value).val.d = *(double *)&local_2c8->value;
                (data->value).val.m.data = (uchar *)(local_2c8->value).val.d;
                list_append_new(&ptVar6->params,data);
              }
              free(ptVar8);
            }
            list_append_new((list_t *)(pcVar5 + 0x100),ptVar6);
          }
          new_2 = (thecl_instr_t *)((long)&new_2->type + (long)(int)(uint)(byte)new_2->field_0x6);
        }
        list_append_new((list_t *)&stream_local->_IO_buf_end,pcVar5);
      }
      file_munmap(map_00,length);
    }
  }
  return (thecl_t *)stream_local;
}

Assistant:

static thecl_t*
th06_open(
    FILE* stream,
    unsigned int version)
{
    long file_size;
    unsigned char* map;

    const th06_header_t* header;

    file_size = file_fsize(stream);
    if (file_size == -1)
        return NULL;

    map = file_mmap(stream, file_size);
    if (!map)
        return NULL;

    /* TODO: Check magic. */
    if (version >= 8)
        header = (th06_header_t*)(map + sizeof(uint32_t));
    else
        header = (th06_header_t*)map;

    size_t timeline_count;
    size_t timeline_count_max;
    if (version == 9) {
        timeline_count = header->timeline_count;
        timeline_count_max = header->timeline_count;
    } else if (version == 6) {
        timeline_count = 1;
        timeline_count_max = 3;
    } else {
        timeline_count = header->timeline_count;
        timeline_count_max = 16;
    }

    thecl_t* ecl = thecl_new();
    ecl->version = version;
    ecl->sub_count = header->sub_count;

    for (size_t s = 0; s < header->sub_count; ++s) {
        unsigned int rank = 0xff << 8;
        char name[256];
        thecl_sub_t* sub = malloc(sizeof(*sub));
        memset(sub, 0, sizeof(*sub));
        sprintf(name, "Sub%zu", s);
        sub->name = strdup(name);
        sub->format = NULL;
        list_init(&sub->instrs);
        list_init(&sub->labels);
        unsigned int time = 0;

        const void* raw_sub = map + header->offsets[timeline_count_max + s];
        const th06_instr_t* raw_instr = (th06_instr_t*)(raw_sub);
        while (raw_instr->time != 0xffffffff && raw_instr->size) {
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                time = raw_instr->time;
            }

            if (raw_instr->rank_mask != rank) {
                uint16_t rank_mask = raw_instr->rank_mask >> 8;
                if (version == 6 || version == 7)
                    rank_mask |= 0xf0;
                thecl_instr_t* new = thecl_instr_rank(rank_mask & 0xff);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                rank = raw_instr->rank_mask;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->id = raw_instr->id;
            instr->size = raw_instr->size;
            instr->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
            instr->address = instr->offset + header->offsets[timeline_count_max + s];

            const char* format;

            if (raw_instr->id == 0)
                format = "";
            else
                format = th06_find_format(version, raw_instr->id, 0);

            if (!format) {
                fprintf(stderr, "%-3d %04xB R%04x [%04x]: ",
                    raw_instr->id,
                    raw_instr->size,
                    raw_instr->rank_mask,
                    raw_instr->param_mask
                );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
                goto next;
            }

            if (raw_instr->size > sizeof(th06_instr_t)) {
                value_t* values;
                if (version == 7 || version == 95)
                    values = value_list_from_data(th95_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else if (version == 8)
                    values = value_list_from_data(th08_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else
                    values = value_list_from_data(th06_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                value_t* value_iter = values;
                uint16_t param_mask = raw_instr->param_mask;

                size_t p = 0;
                char f;
                while (value_iter->type) {
                    f = format[p];
                    thecl_param_t* param = param_new(f);
                    param->value = *value_iter;
                    if (version != 6 && param_mask & 1)
                        param->stack = 1;
                    param_mask >>= 1;
                    ++value_iter;
                    ++p;
                    list_append_new(&instr->params, param);
                }
                free(values);
            }

            list_append_new(&sub->instrs, instr);

next:
            raw_instr = (th06_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->subs, sub);
    }

    th06_insert_labels(ecl);

    thecl_timeline_t* timeline;

    for (size_t e = 0; e < timeline_count; ++e) {
        char name[128];
        sprintf(name, "Timeline%zu", e);

        timeline = malloc(sizeof(*timeline));
        strcpy(timeline->name, name);
        list_init(&timeline->instrs);

        uint16_t time = 0;
        uint8_t rank = version >= 8 ? 0xff : 0x00;
        th06_timeline_instr_t* raw_instr = (th06_timeline_instr_t*)(map + header->offsets[e]);
        while(!th06_check_timeline_sentinel(version, raw_instr)) {
            if (raw_instr->rank != rank) {
                thecl_instr_t* new = thecl_instr_rank(raw_instr->rank);
                list_append_new(&timeline->instrs, new);
                rank = raw_instr->rank;
            }
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                list_append_new(&timeline->instrs, new);
                time = raw_instr->time;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->size = raw_instr->size;
            instr->id = raw_instr->id;

            const char* format = th06_find_timeline_format(version, raw_instr->id);

            if (!format) {
                fprintf(stderr, "%-3d %04xB: ",
                    raw_instr->id,
                    raw_instr->size
                    );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_timeline_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
            } else {
                thecl_param_t* param0 = param_new(format[0]);
                param0->value.val.s = raw_instr->arg0;
                list_append_new(&instr->params, param0);

                if (raw_instr->size > sizeof(th06_timeline_instr_t)) {
                    /* The first parameter is in the struct and is always s, so it needs to be ignored here. */
                    value_t* values = value_list_from_data(value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_timeline_instr_t), format + 1);
                    value_t* value_iter = values;
                    while (value_iter->type) {
                        thecl_param_t* param = param_new(value_iter->type);
                        param->value = *value_iter;
                        ++value_iter;
                        list_append_new(&instr->params, param);
                    }
                    free(values);
                }

                list_append_new(&timeline->instrs, instr);
            }

            raw_instr = (th06_timeline_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->timelines, timeline);
    }

    file_munmap(map, file_size);

    return ecl;
}